

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O2

int __thiscall
Centaurus::CATNMachine<wchar_t>::import_whitespace
          (CATNMachine<wchar_t> *this,CharClass<wchar_t> *cc,int origin,int tag)

{
  int dest;
  CharClass<wchar_t> local_38;
  
  local_38._vptr_CharClass = (_func_int **)&PTR__CharClass_001984f8;
  local_38.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.m_ranges.
  super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  dest = add_node(this,&local_38,origin,tag);
  CharClass<wchar_t>::~CharClass(&local_38);
  CATNNode<wchar_t>::add_transition
            ((this->m_nodes).
             super__Vector_base<Centaurus::CATNNode<wchar_t>,_std::allocator<Centaurus::CATNNode<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start + dest,cc,dest,0);
  return dest;
}

Assistant:

int import_whitespace(const CharClass<TCHAR>& cc, int origin, int tag)
    {
        origin = add_node(CharClass<TCHAR>(), origin, tag);
        m_nodes[origin].add_transition(cc, origin);
        return origin;
    }